

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int s390_store_adtl_status(S390CPU *cpu,hwaddr addr,hwaddr len)

{
  ulong uVar1;
  _Bool _Var2;
  void *buffer;
  long lVar3;
  hwaddr hVar4;
  int iVar5;
  hwaddr save;
  hwaddr local_28;
  
  local_28 = len;
  buffer = cpu_physical_memory_map_s390x((cpu->parent_obj).as,addr,&local_28,true);
  if (buffer == (void *)0x0) {
    return -0xe;
  }
  if (local_28 == len) {
    _Var2 = s390_has_feat((cpu->env).uc,S390_FEAT_VECTOR);
    if (_Var2) {
      lVar3 = 0;
      do {
        uVar1 = *(ulong *)((long)(cpu->env).vregs[0] + lVar3);
        *(ulong *)((long)buffer + lVar3) =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        uVar1 = *(ulong *)((long)(cpu->env).vregs[0] + lVar3 + 8);
        *(ulong *)((long)buffer + lVar3 + 8) =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x200);
    }
    _Var2 = s390_has_feat((cpu->env).uc,S390_FEAT_GUARDED_STORAGE);
    iVar5 = 0;
    hVar4 = len;
    if (0x7ff < len) {
      if (!_Var2) goto LAB_00cb3332;
      lVar3 = 0;
      do {
        uVar1 = (cpu->env).gscb[lVar3];
        *(ulong *)((long)buffer + lVar3 * 8 + 0x400) =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
    }
    iVar5 = 0;
  }
  else {
    iVar5 = -0xe;
    hVar4 = 0;
  }
LAB_00cb3332:
  cpu_physical_memory_unmap_s390x((cpu->parent_obj).as,buffer,len,true,hVar4);
  return iVar5;
}

Assistant:

int s390_store_adtl_status(S390CPU *cpu, hwaddr addr, hwaddr len)
{
    SigpAdtlSaveArea *sa;
    hwaddr save = len;
    int i;

    sa = cpu_physical_memory_map(CPU(cpu)->as, addr, &save, true);
    if (!sa) {
        return -EFAULT;
    }
    if (save != len) {
        cpu_physical_memory_unmap(CPU(cpu)->as, sa, len, 1, 0);
        return -EFAULT;
    }

    if (s390_has_feat(cpu->env.uc, S390_FEAT_VECTOR)) {
        for (i = 0; i < 32; i++) {
            sa->vregs[i][0] = cpu_to_be64(cpu->env.vregs[i][0]);
            sa->vregs[i][1] = cpu_to_be64(cpu->env.vregs[i][1]);
        }
    }
    if (s390_has_feat(cpu->env.uc, S390_FEAT_GUARDED_STORAGE) && len >= ADTL_GS_MIN_SIZE) {
        for (i = 0; i < 4; i++) {
            sa->gscb[i] = cpu_to_be64(cpu->env.gscb[i]);
        }
    }

    cpu_physical_memory_unmap(CPU(cpu)->as, sa, len, 1, len);
    return 0;
}